

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryBuilder::visitCall(WasmBinaryBuilder *this,Call *curr)

{
  bool bVar1;
  size_t size;
  Expression *pEVar2;
  vector<wasm::Name*,std::allocator<wasm::Name*>> *this_00;
  undefined1 local_48 [8];
  Signature sig;
  uint32_t local_2c [2];
  uint32_t index;
  
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"zz node: Call\n",0xe);
  }
  local_2c[0] = getU32LEB(this);
  _local_48 = getSignatureByFunctionIndex(this,local_2c[0]);
  size = wasm::Type::size((Type *)local_48);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
            (&(curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,size);
  while( true ) {
    if (size == 0) {
      (curr->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id =
           sig.params.id;
      this_00 = (vector<wasm::Name*,std::allocator<wasm::Name*>> *)
                std::
                map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
                ::operator[](&this->functionRefs,local_2c);
      sig.results.id = (uintptr_t)&curr->target;
      std::vector<wasm::Name*,std::allocator<wasm::Name*>>::emplace_back<wasm::Name*>
                (this_00,(Name **)&sig.results);
      Call::finalize(curr);
      return;
    }
    size = size - 1;
    pEVar2 = popNonVoidExpression(this);
    if ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements <= size) break;
    (curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
    [size] = pEVar2;
  }
  __assert_fail("index < usedElements",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                ,0xbc,
                "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
               );
}

Assistant:

void WasmBinaryBuilder::visitCall(Call* curr) {
  BYN_TRACE("zz node: Call\n");
  auto index = getU32LEB();
  auto sig = getSignatureByFunctionIndex(index);
  auto num = sig.params.size();
  curr->operands.resize(num);
  for (size_t i = 0; i < num; i++) {
    curr->operands[num - i - 1] = popNonVoidExpression();
  }
  curr->type = sig.results;
  // We don't know function names yet.
  functionRefs[index].push_back(&curr->target);
  curr->finalize();
}